

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

uint GetNgonBoundarySegments
               (ON_MeshFaceList *face_list,uint ngon_fi_count,uint *ngon_fi,uint ngon_boundary_index
               ,NgonNeighbors *ngon_nbr_map,ON_SimpleArray<unsigned_int> *ngon_vi,
               ON_SimpleArray<unsigned_int> *ngon_side)

{
  ON_SimpleArray<unsigned_int> *this;
  uint *puVar1;
  ulong uVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  NgonNeighbors *pNVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  uint vi1;
  uint vi0;
  uint local_a8 [7];
  uint local_8c;
  ON_SimpleArray<unsigned_int> *local_88;
  ulong local_80;
  uint local_74;
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  uint *local_60;
  uint local_54;
  NgonNeighbors *local_50;
  ON_MeshFaceList *local_48;
  ulong local_40;
  ulong local_38;
  
  local_88 = ngon_vi;
  uVar2 = (ulong)ngon_boundary_index;
  uVar7 = 0;
  uVar3 = 0;
  if (ngon_nbr_map != (NgonNeighbors *)0x0 && (ngon_fi != (uint *)0x0 && ngon_fi_count != 0)) {
    local_60 = ngon_fi;
    if (ngon_fi_count == 1) {
      uVar3 = uVar7;
      if ((((ngon_nbr_map->m_NFS[0] == 0) && (ngon_nbr_map->m_NFS[1] == 0)) &&
          (ngon_nbr_map->m_NFS[2] == 0)) && (ngon_nbr_map->m_NFS[3] == 0)) {
        if (*ngon_fi < face_list->m_face_count) {
          puVar1 = face_list->m_faces;
          uVar5 = (ulong)(*ngon_fi * face_list->m_face_stride);
          local_a8[1] = puVar1[uVar5 + 1];
          local_a8[0] = puVar1[uVar5];
          local_a8[3] = puVar1[uVar5 + 2];
          if (face_list->m_bQuadFaces == true) {
            local_a8[3] = puVar1[uVar5 + 3];
          }
          local_a8[2] = puVar1[uVar5 + 2];
        }
        else {
          local_a8[0] = 0;
          local_a8[1] = 0;
          local_a8[2] = 0;
          local_a8[3] = 0;
        }
        if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(ngon_vi,local_a8);
        }
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          puVar1 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar1 = 0;
        }
        ngon_nbr_map->m_NFS[0] = uVar2 * 8 + 1;
        if (local_88 != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(local_88,local_a8 + 1);
        }
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          puVar1 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar1 = 1;
        }
        uVar3 = ngon_boundary_index + 2;
        ngon_nbr_map->m_NFS[1] = (ulong)(ngon_boundary_index + 1) * 8 + 1;
        if (local_a8[2] != local_a8[3]) {
          if (local_88 != (ON_SimpleArray<unsigned_int> *)0x0) {
            ON_SimpleArray<unsigned_int>::Append(local_88,local_a8 + 2);
          }
          if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
            puVar1 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
            *puVar1 = 2;
          }
          uVar2 = (ulong)uVar3;
          uVar3 = ngon_boundary_index + 3;
          ngon_nbr_map->m_NFS[2] = uVar2 * 8 + 1;
        }
        if (local_88 != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(local_88,local_a8 + 3);
        }
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          puVar1 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar1 = 3;
        }
        ngon_nbr_map->m_NFS[3] = (ulong)uVar3 * 8 + 1;
        uVar3 = (uVar3 - ngon_boundary_index) + 1;
      }
    }
    else {
      uVar3 = 0;
      bVar9 = ngon_fi_count != 0;
      local_80 = uVar2;
      local_48 = face_list;
      local_68 = CONCAT44(in_register_00000034,ngon_fi_count);
      if (ngon_fi_count == 0) {
        uVar8 = 0;
        uVar5 = 0;
      }
      else {
        puVar1 = face_list->m_faces;
        uVar8 = 0;
        pNVar4 = ngon_nbr_map;
        do {
          if (ngon_fi[uVar8] < face_list->m_face_count) {
            uVar5 = (ulong)(ngon_fi[uVar8] * face_list->m_face_stride);
            local_a8[1] = puVar1[uVar5 + 1];
            local_a8[0] = puVar1[uVar5];
            local_a8[3] = puVar1[uVar5 + 2];
            if ((face_list->m_bQuadFaces & 1U) != 0) {
              local_a8[3] = puVar1[uVar5 + 3];
            }
            local_a8[2] = puVar1[uVar5 + 2];
          }
          else {
            local_a8[0] = 0;
            local_a8[1] = 0;
            local_a8[2] = 0;
            local_a8[3] = 0;
          }
          uVar5 = 0;
          do {
            uVar6 = uVar5 + 1;
            if ((local_a8[uVar5] != local_a8[(uint)uVar6 & 3]) && (pNVar4->m_NFS[uVar5] == 0))
            goto LAB_0052fa58;
            uVar5 = uVar6;
          } while (uVar6 != 4);
          uVar8 = uVar8 + 1;
          bVar9 = uVar8 < ngon_fi_count;
          pNVar4 = pNVar4 + 1;
          ngon_fi = local_60;
        } while (uVar8 != ngon_fi_count);
        uVar5 = 4;
      }
LAB_0052fa58:
      if (bVar9) {
        local_50 = ngon_nbr_map;
        ngon_nbr_map[uVar8 & 0xffffffff].m_NFS[uVar5 & 0xffffffff] = uVar2 * 8 + 1;
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          puVar1 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar1 = (int)uVar5 + (int)uVar8 * 8;
        }
        this = local_88;
        local_74 = (int)local_68 * 2 + 2;
        local_6c = local_a8[uVar5 & 0xffffffff];
        uVar2 = (ulong)((int)uVar5 + 1U & 3);
        local_8c = local_a8[uVar2];
        if (local_88 != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(local_88,&local_6c);
          ON_SimpleArray<unsigned_int>::Append(this,&local_8c);
        }
        if (local_74 != 0) {
          local_54 = (int)local_68 * 2 - 1;
          uVar3 = ngon_boundary_index + 1;
          local_70 = 0;
          do {
            pNVar4 = local_50;
            uVar5 = uVar8 & 0xffffffff;
            local_38 = uVar5;
            local_40 = uVar8;
            uVar7 = 0;
            do {
              if (pNVar4[uVar5].m_NFS[uVar2] != 0) goto LAB_0052fbcb;
              uVar6 = (ulong)((int)uVar2 + 1U & 3);
              if (local_8c != local_a8[uVar6]) {
                pNVar4[uVar5].m_NFS[uVar2] = (ulong)uVar3 * 8 + 1;
                if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
                  puVar1 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
                  *puVar1 = (int)uVar2 + (int)uVar8 * 8;
                }
                uVar3 = uVar3 + 1;
                local_8c = local_a8[uVar6];
                if (local_6c == local_a8[uVar6]) {
                  if (uVar3 - (int)local_80 < 3) {
                    return 0;
                  }
                  return uVar3 - (int)local_80;
                }
                if (local_88 != (ON_SimpleArray<unsigned_int> *)0x0) {
                  ON_SimpleArray<unsigned_int>::Append(local_88,&local_8c);
                }
              }
              uVar7 = uVar7 + 1;
              uVar2 = uVar6;
            } while (uVar7 != 4);
            uVar7 = 4;
LAB_0052fbcb:
            if (3 < uVar7) {
              return 0;
            }
            uVar2 = local_50[local_38].m_NFS[uVar2];
            if ((uVar2 & 4) == 0) {
              return 0;
            }
            uVar8 = uVar2 >> 3;
            if ((uint)local_40 == (uint)uVar8) {
              return 0;
            }
            if ((uint)local_68 <= (uint)uVar8) {
              return 0;
            }
            if (local_60[uVar8 & 0xffffffff] < local_48->m_face_count) {
              puVar1 = local_48->m_faces;
              uVar5 = (ulong)(local_60[uVar8 & 0xffffffff] * local_48->m_face_stride);
              local_a8[1] = puVar1[uVar5 + 1];
              local_a8[0] = puVar1[uVar5];
              local_a8[3] = puVar1[uVar5 + 2];
              if (local_48->m_bQuadFaces == true) {
                local_a8[3] = puVar1[uVar5 + 3];
              }
              local_a8[2] = puVar1[uVar5 + 2];
            }
            else {
              local_a8[0] = 0;
              local_a8[1] = 0;
              local_a8[2] = 0;
              local_a8[3] = 0;
            }
            uVar2 = (ulong)((int)uVar2 + 1U & 3);
            if (local_8c != local_a8[uVar2]) {
              return 0;
            }
            if (local_54 < local_70 + 1) {
              return 0;
            }
            local_70 = local_70 + 1;
            if (local_74 < uVar3 - (int)local_80) {
              return 0;
            }
          } while( true );
        }
      }
    }
  }
  return uVar3;
}

Assistant:

static unsigned int GetNgonBoundarySegments(
  const ON_MeshFaceList& face_list,
  unsigned int ngon_fi_count,
  const unsigned int* ngon_fi,
  unsigned int ngon_boundary_index,
  struct NgonNeighbors* ngon_nbr_map,
  ON_SimpleArray<unsigned int>* ngon_vi,
  ON_SimpleArray<unsigned int>* ngon_side
  )
{
  unsigned int j0, next_j0, j1;
  unsigned int Fvi[4];
  unsigned int vi0, vi1, fi, max_vertex_count;
  unsigned int ngon_fdex, nbr_ngon_fdex, face_vist_count, max_face_visit_count;

  const unsigned int ngon_boundary_index0 = ngon_boundary_index;

  if ( ngon_fi_count <= 0 || 0 == ngon_fi || 0 == ngon_nbr_map )
    return 0;

  if ( 1 == ngon_fi_count )
  {
    if (    0 != ngon_nbr_map[0].m_NFS[0] 
         || 0 != ngon_nbr_map[0].m_NFS[1] 
         || 0 != ngon_nbr_map[0].m_NFS[2] 
         || 0 != ngon_nbr_map[0].m_NFS[3] 
         )
    {
      return 0;
    }
    face_list.QuadFvi(ngon_fi[0],Fvi);

    if ( ngon_vi )
      ngon_vi->Append(Fvi[0]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,0,false);
    ngon_nbr_map[0].m_NFS[0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    if ( ngon_vi )
      ngon_vi->Append(Fvi[1]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,1,false);
    ngon_nbr_map[0].m_NFS[1] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    if ( Fvi[2] != Fvi[3] )
    {
      if ( ngon_vi )
        ngon_vi->Append(Fvi[2]);
      if ( ngon_side )
        ngon_side->AppendNew() = EncodeNgonSide(0,2,false);
      ngon_nbr_map[0].m_NFS[2] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
    }

    if ( ngon_vi )
      ngon_vi->Append(Fvi[3]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,3,false);
    ngon_nbr_map[0].m_NFS[3] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    return ngon_boundary_index - ngon_boundary_index0;
  }


  fi = 0;  // keep lint quiet - at this point ngon_fi_count > 0
  j0 = 0;  // keep lint quiet - at this point ngon_fi_count > 0
  
  // find a boundary edge
  for ( ngon_fdex = 0; ngon_fdex < ngon_fi_count; ngon_fdex++ )
  {
    fi = ngon_fi[ngon_fdex];
    face_list.QuadFvi(fi,Fvi);
    for ( j0 = 0; j0 < 4; j0++ )
    {
      if ( Fvi[j0] == Fvi[(j0+1)%4] )
        continue;
      if ( 0 != ngon_nbr_map[ngon_fdex].m_NFS[j0] )
        continue; // has a neighbor or is part of a previously found boundary component when holes are allowed

      // we being at the vertex with index Fvi[j]
      break;
    }    
    if ( j0 < 4 )
      break;
  }
  
  if ( ngon_fdex >= ngon_fi_count )
    return 0;

  // max_vertex_count is used to prevent infinite recursion
  // when the mesh information is not valid or there is
  // a bug in this code.  The maximum value occurs
  // for a strip of quads.
  max_vertex_count = 2*ngon_fi_count + 2;


  // max_face_visit_count is used to prevent infinite recursion
  // when the mesh information is not valid or there is
  // a bug in this code.  The maximum value occurs
  // for a strip of quads when the initial face is
  // at the end of a strip.
  max_face_visit_count = 2*ngon_fi_count - 1;

  ngon_nbr_map[ngon_fdex].m_NFS[j0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
  if ( ngon_side )
    ngon_side->AppendNew() = EncodeNgonSide(ngon_fdex,j0,false);

  vi0 = Fvi[j0];
  j0 = (j0+1)%4;
  vi1 = Fvi[j0];
  if ( ngon_vi )
  {
    ngon_vi->Append(vi0);
    ngon_vi->Append(vi1);
  }
  for ( face_vist_count = 0;
        face_vist_count <= max_face_visit_count && ngon_boundary_index - ngon_boundary_index0 <= max_vertex_count;
        face_vist_count++ 
      )
  {
    for (j1 = 0; j1 < 4; j1++, j0 = next_j0 )
    {
      if ( 0 != ngon_nbr_map[ngon_fdex].m_NFS[j0] )
        break; // has a neighbor or is a boundary

      next_j0 = (j0+1)%4;
      if ( vi1 == Fvi[next_j0] )
        continue; // skip over duplicate vertex in triangles

      ngon_nbr_map[ngon_fdex].m_NFS[j0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
      if ( ngon_side )
        ngon_side->AppendNew() = EncodeNgonSide(ngon_fdex,j0,false);

      vi1 = Fvi[next_j0];
      if ( vi0 == vi1 )
      {
        // this is where successful searches end with (ngon_vi.Count() >= 3)
        if ( ngon_boundary_index - ngon_boundary_index0 >= 3 )
        {
          return ngon_boundary_index - ngon_boundary_index0;
        }
        return 0;
      }
      if ( ngon_vi )
        ngon_vi->Append(vi1);
    }

    if ( j1 >= 4 )
      break; // not expected - there is a bug or a bogus mesh

    if ( false == IsNFS_Neighbor(ngon_nbr_map[ngon_fdex].m_NFS[j0]) )
      break; // not expected - there is a bug or a bogus mesh

    // switch to neighbor face;
    nbr_ngon_fdex = (unsigned int)DecodeNFS_NgonFaceIndex(ngon_nbr_map[ngon_fdex].m_NFS[j0]);

    if ( nbr_ngon_fdex == ngon_fdex || nbr_ngon_fdex >= ngon_fi_count )
    {
      // Unexpected - bail rather than crash.
      // This means there is a bug in the code that 
      // set the values in the ngon_nbr_map[] array.
      // The same face may be visited multiple times (strip of quads for example),
      // but a face can never be its own neighbor.
      break;
    }

    // move onto the neighbor
    j0 = DecodeNFS_EdgeIndex(ngon_nbr_map[ngon_fdex].m_NFS[j0]);

    ngon_fdex = nbr_ngon_fdex;
    fi = ngon_fi[ngon_fdex];
    face_list.QuadFvi(fi,Fvi);
    // faces have compatible orientations 
    // (The shared edge is reversed when going to neighboring face)
    j0 = (j0+1)%4; // move the the vertex at the end of the shared edge

    if ( vi1 != Fvi[j0] )
    {
      // not expected - there is a bug or a bogus mesh
      break;
    }
  }

  return 0;
}